

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O1

void __thiscall
BlockFilterIndex::BlockFilterIndex
          (BlockFilterIndex *this,
          unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> chain,
          BlockFilterType filter_type,size_t n_cache_size,bool f_memory,bool f_wipe)

{
  uint256 *puVar1;
  pointer pcVar2;
  string name;
  path dir;
  base_blob<256U> *pbVar3;
  _Alloc_hider __p_00;
  char cVar4;
  string *psVar5;
  DB *this_00;
  FlatFileSeq *this_01;
  invalid_argument *this_02;
  pointer __p;
  long in_FS_OFFSET;
  path path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined8 in_stack_fffffffffffffe58;
  unique_ptr<FlatFileSeq,_std::default_delete<FlatFileSeq>_> *this_03;
  undefined8 in_stack_fffffffffffffe60;
  unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_> *this_04;
  long *plVar6;
  undefined8 uVar7;
  _Alloc_hider in_stack_fffffffffffffe70;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> in_stack_fffffffffffffe78;
  path local_168;
  path local_140;
  path local_118;
  path local_f0;
  path local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_80;
  path local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar6 = *(long **)chain._M_t.
                     super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                     .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  *(undefined8 *)
   chain._M_t.super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t
   .super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
   super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl = 0;
  psVar5 = BlockFilterTypeName_abi_cxx11_(filter_type);
  pcVar2 = (psVar5->_M_dataplus)._M_p;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar2,pcVar2 + psVar5->_M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_a0," block filter index");
  name._M_string_length = in_stack_fffffffffffffe60;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe58;
  name.field_2._M_allocated_capacity = (size_type)plVar6;
  name.field_2._8_8_ = in_stack_fffffffffffffe70._M_p;
  BaseIndex::BaseIndex
            (&this->super_BaseIndex,
             (unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>)
             &stack0xfffffffffffffe68,name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (plVar6 != (long *)0x0) {
    (**(code **)(*plVar6 + 8))();
  }
  uVar7 = 0;
  (this->super_BaseIndex).super_CValidationInterface._vptr_CValidationInterface =
       (_func_int **)&PTR_UpdatedBlockTip_00b14b30;
  this->m_filter_type = filter_type;
  this_04 = &this->m_db;
  (this->m_db)._M_t.super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>._M_t.
  super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>.
  super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl = (DB *)0x0;
  (this->m_next_filter_pos).nFile = -1;
  this_03 = &this->m_filter_fileseq;
  *(undefined8 *)&(this->m_next_filter_pos).nPos = 0;
  *(undefined8 *)
   ((long)&(this->m_filter_fileseq)._M_t.
           super___uniq_ptr_impl<FlatFileSeq,_std::default_delete<FlatFileSeq>_>._M_t.
           super__Tuple_impl<0UL,_FlatFileSeq_*,_std::default_delete<FlatFileSeq>_>.
           super__Head_base<0UL,_FlatFileSeq_*,_false>._M_head_impl + 4) = 0;
  *(undefined8 *)((long)&(this->m_cs_headers_cache).super_mutex.super___mutex_base._M_mutex + 4) = 0
  ;
  *(undefined8 *)((long)&(this->m_cs_headers_cache).super_mutex.super___mutex_base._M_mutex + 0xc) =
       0;
  *(undefined8 *)((long)&(this->m_cs_headers_cache).super_mutex.super___mutex_base._M_mutex + 0x14)
       = 0;
  *(undefined8 *)
   ((long)&(this->m_cs_headers_cache).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev +
   4) = 0;
  *(undefined4 *)((long)&(this->m_cs_headers_cache).super_mutex.super___mutex_base._M_mutex + 0x24)
       = 0;
  (this->m_headers_cache)._M_h._M_buckets = &(this->m_headers_cache)._M_h._M_single_bucket;
  (this->m_headers_cache)._M_h._M_bucket_count = 1;
  (this->m_headers_cache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_headers_cache)._M_h._M_element_count = 0;
  (this->m_headers_cache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_headers_cache)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_headers_cache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  puVar1 = &this->m_last_header;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar3 = &(this->m_last_header).super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[8] = '\0';
  (pbVar3->m_data)._M_elems[9] = '\0';
  (pbVar3->m_data)._M_elems[10] = '\0';
  (pbVar3->m_data)._M_elems[0xb] = '\0';
  (pbVar3->m_data)._M_elems[0xc] = '\0';
  (pbVar3->m_data)._M_elems[0xd] = '\0';
  (pbVar3->m_data)._M_elems[0xe] = '\0';
  (pbVar3->m_data)._M_elems[0xf] = '\0';
  pbVar3 = &(this->m_last_header).super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x10] = '\0';
  (pbVar3->m_data)._M_elems[0x11] = '\0';
  (pbVar3->m_data)._M_elems[0x12] = '\0';
  (pbVar3->m_data)._M_elems[0x13] = '\0';
  (pbVar3->m_data)._M_elems[0x14] = '\0';
  (pbVar3->m_data)._M_elems[0x15] = '\0';
  (pbVar3->m_data)._M_elems[0x16] = '\0';
  (pbVar3->m_data)._M_elems[0x17] = '\0';
  pbVar3 = &(this->m_last_header).super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x18] = '\0';
  (pbVar3->m_data)._M_elems[0x19] = '\0';
  (pbVar3->m_data)._M_elems[0x1a] = '\0';
  (pbVar3->m_data)._M_elems[0x1b] = '\0';
  (pbVar3->m_data)._M_elems[0x1c] = '\0';
  (pbVar3->m_data)._M_elems[0x1d] = '\0';
  (pbVar3->m_data)._M_elems[0x1e] = '\0';
  (pbVar3->m_data)._M_elems[0x1f] = '\0';
  psVar5 = BlockFilterTypeName_abi_cxx11_(filter_type);
  if (psVar5->_M_string_length == 0) {
    this_02 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_02,"unknown filter_type");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(this_02,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    goto LAB_0047b5d1;
  }
  ArgsManager::GetDataDir((path *)&local_140,&gArgs,true);
  std::filesystem::__cxx11::path::_M_append(&local_140,7,"indexes");
  std::filesystem::__cxx11::path::path(&local_118,&local_140);
  std::filesystem::__cxx11::path::_M_append(&local_118,0xb,"blockfilter");
  std::filesystem::__cxx11::path::path(&local_f0,&local_118);
  pcVar2 = (psVar5->_M_dataplus)._M_p;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::u8string::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((u8string *)&local_80,pcVar2,pcVar2 + psVar5->_M_string_length);
  std::filesystem::__cxx11::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
            (&local_60,&local_80,auto_format);
  std::filesystem::__cxx11::path::path(&local_168,&local_60);
  std::filesystem::__cxx11::path::~path(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::operator/=(&local_f0,(path *)&local_168);
  std::filesystem::__cxx11::path::path(&local_c8,&local_f0);
  std::filesystem::__cxx11::path::~path(&local_168);
  std::filesystem::__cxx11::path::~path(&local_f0);
  std::filesystem::__cxx11::path::~path(&local_118);
  std::filesystem::__cxx11::path::~path(&local_140);
  cVar4 = std::filesystem::symlink_status((path *)&local_c8);
  if (cVar4 == '\x03') {
    cVar4 = std::filesystem::status((path *)&local_c8);
    if (cVar4 != '\x02') goto LAB_0047b288;
  }
  else {
LAB_0047b288:
    std::filesystem::create_directories((path *)&local_c8);
  }
  std::filesystem::__cxx11::path::path((path *)&stack0xfffffffffffffe70,&local_c8);
  std::filesystem::__cxx11::path::_M_append(&stack0xfffffffffffffe70,2,"db");
  std::filesystem::__cxx11::path::path(&local_60,(path *)&stack0xfffffffffffffe70);
  this_00 = (DB *)operator_new(0x70);
  BaseIndex::DB::DB(this_00,(path *)&local_60,n_cache_size,f_memory,f_wipe,false);
  local_168._M_pathname._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>::reset
            ((__uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_> *)this_04,this_00)
  ;
  std::unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>::~unique_ptr
            ((unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_> *)&local_168);
  std::filesystem::__cxx11::path::~path(&local_60);
  std::filesystem::__cxx11::path::~path((path *)&stack0xfffffffffffffe70);
  this_01 = (FlatFileSeq *)operator_new(0x38);
  std::filesystem::__cxx11::path::path(&local_60,&local_c8);
  dir.super_path._M_pathname._M_string_length = (size_type)this_04;
  dir.super_path._M_pathname._M_dataplus._M_p = (pointer)this_03;
  dir.super_path._M_pathname.field_2._M_allocated_capacity = uVar7;
  dir.super_path._M_pathname.field_2._8_8_ = in_stack_fffffffffffffe70._M_p;
  dir.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )in_stack_fffffffffffffe78._M_head_impl;
  FlatFileSeq::FlatFileSeq(this_01,dir,(char *)&local_60,0x82ca2b);
  local_168._M_pathname._M_dataplus._M_p = (pointer)this_01;
  std::filesystem::__cxx11::path::~path(&local_60);
  __p_00._M_p = local_168._M_pathname._M_dataplus._M_p;
  local_168._M_pathname._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<FlatFileSeq,_std::default_delete<FlatFileSeq>_>::reset
            ((__uniq_ptr_impl<FlatFileSeq,_std::default_delete<FlatFileSeq>_> *)this_03,
             (pointer)__p_00._M_p);
  std::unique_ptr<FlatFileSeq,_std::default_delete<FlatFileSeq>_>::~unique_ptr
            ((unique_ptr<FlatFileSeq,_std::default_delete<FlatFileSeq>_> *)&local_168);
  std::filesystem::__cxx11::path::~path(&local_c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0047b5d1:
  __stack_chk_fail();
}

Assistant:

BlockFilterIndex::BlockFilterIndex(std::unique_ptr<interfaces::Chain> chain, BlockFilterType filter_type,
                                   size_t n_cache_size, bool f_memory, bool f_wipe)
    : BaseIndex(std::move(chain), BlockFilterTypeName(filter_type) + " block filter index")
    , m_filter_type(filter_type)
{
    const std::string& filter_name = BlockFilterTypeName(filter_type);
    if (filter_name.empty()) throw std::invalid_argument("unknown filter_type");

    fs::path path = gArgs.GetDataDirNet() / "indexes" / "blockfilter" / fs::u8path(filter_name);
    fs::create_directories(path);

    m_db = std::make_unique<BaseIndex::DB>(path / "db", n_cache_size, f_memory, f_wipe);
    m_filter_fileseq = std::make_unique<FlatFileSeq>(std::move(path), "fltr", FLTR_FILE_CHUNK_SIZE);
}